

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O1

bool __thiscall
units::fixed_precise_measurement::operator==
          (fixed_precise_measurement *this,fixed_precise_measurement *val)

{
  bool bVar1;
  double val_00;
  precise_unit local_28;
  
  local_28.multiplier_ = (val->units_).multiplier_;
  local_28.base_units_ = (val->units_).base_units_;
  local_28.commodity_ = (val->units_).commodity_;
  bVar1 = precise_unit::operator==(&this->units_,&local_28);
  if (bVar1) {
    val_00 = val->value_;
  }
  else {
    val_00 = value_as(val,&this->units_);
  }
  bVar1 = operator==(this,val_00);
  return bVar1;
}

Assistant:

bool operator==(const fixed_precise_measurement& val) const
    {
        return operator==(
            (units_ == val.units()) ? val.value() : val.value_as(units_));
    }